

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void google::protobuf::compiler::cpp::PublicImportDFS
               (FileDescriptor *fd,
               unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *fd_set)

{
  int iVar1;
  int iVar2;
  pair<std::__detail::_Node_iterator<const_google::protobuf::FileDescriptor_*,_true,_false>,_bool>
  pVar3;
  FileDescriptor *local_28;
  FileDescriptor *dep;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *puStack_18;
  int i;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *fd_set_local;
  FileDescriptor *fd_local;
  
  dep._4_4_ = 0;
  puStack_18 = fd_set;
  fd_set_local = (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)fd;
  while( true ) {
    iVar1 = dep._4_4_;
    iVar2 = FileDescriptor::public_dependency_count((FileDescriptor *)fd_set_local);
    if (iVar2 <= iVar1) break;
    local_28 = FileDescriptor::public_dependency((FileDescriptor *)fd_set_local,dep._4_4_);
    pVar3 = std::
            unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::insert(puStack_18,&local_28);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      PublicImportDFS(local_28,puStack_18);
    }
    dep._4_4_ = dep._4_4_ + 1;
  }
  return;
}

Assistant:

static void PublicImportDFS(const FileDescriptor* fd,
                            std::unordered_set<const FileDescriptor*>* fd_set) {
  for (int i = 0; i < fd->public_dependency_count(); i++) {
    const FileDescriptor* dep = fd->public_dependency(i);
    if (fd_set->insert(dep).second) PublicImportDFS(dep, fd_set);
  }
}